

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

string * __thiscall
logger::Channel::GetPrefix_abi_cxx11_(string *__return_storage_ptr__,Channel *this)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->PrefixLock);
  if (iVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->Prefix)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Prefix)._M_string_length);
    pthread_mutex_unlock((pthread_mutex_t *)&this->PrefixLock);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

std::string Channel::GetPrefix() const
{
    std::lock_guard<std::mutex> locker(PrefixLock);
    return Prefix;
}